

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,REF_DBL *xyz,REF_INT *tet,REF_DBL *bary)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  undefined8 uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  char *pcVar5;
  int cell;
  int cell_00;
  double dVar6;
  double dVar7;
  double local_b8;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  cell = 0;
  cell_00 = -1;
  local_b8 = -999.0;
  do {
    if (ref_cell->max <= cell) {
      if (cell_00 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x381,"ref_grid_exhaustive_enclosing_tet","failed to find cell");
        RVar3 = 1;
      }
      else {
        *tet = cell_00;
        uVar1 = ref_cell_nodes(ref_cell,cell_00,nodes);
        if (uVar1 == 0) {
          uVar1 = ref_node_bary4(ref_node,nodes,xyz,bary);
          if (uVar1 == 0) {
            return 0;
          }
          uVar4 = (ulong)uVar1;
          pcVar5 = "bary";
          uVar2 = 0x385;
        }
        else {
          uVar4 = (ulong)uVar1;
          pcVar5 = "cell";
          uVar2 = 900;
        }
LAB_001573ef:
        RVar3 = (REF_STATUS)uVar4;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               uVar2,"ref_grid_exhaustive_enclosing_tet",uVar4,pcVar5);
      }
      return RVar3;
    }
    if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
      uVar1 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        pcVar5 = "cell";
        uVar2 = 0x378;
        goto LAB_001573ef;
      }
      uVar1 = ref_node_bary4(ref_node,nodes,xyz,bary);
      if ((uVar1 & 0xfffffffb) != 0) {
        uVar4 = (ulong)uVar1;
        pcVar5 = "bary";
        uVar2 = 0x379;
        goto LAB_001573ef;
      }
      dVar6 = *bary;
      if (bary[1] <= *bary) {
        dVar6 = bary[1];
      }
      dVar7 = bary[2];
      if (bary[3] <= bary[2]) {
        dVar7 = bary[3];
      }
      if (dVar7 <= dVar6) {
        dVar6 = dVar7;
      }
      if ((cell_00 == -1) || (local_b8 < dVar6)) {
        local_b8 = dVar6;
        cell_00 = cell;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_grid_exhaustive_enclosing_tet(REF_GRID ref_grid,
                                                            REF_DBL *xyz,
                                                            REF_INT *tet,
                                                            REF_DBL *bary) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT guess, best_guess;
  REF_DBL best_bary, min_bary;

  best_guess = REF_EMPTY;
  best_bary = -999.0;
  each_ref_cell_valid_cell(ref_cell, guess) {
    RSS(ref_cell_nodes(ref_cell, guess, nodes), "cell");
    RXS(ref_node_bary4(ref_node, nodes, xyz, bary), REF_DIV_ZERO, "bary");
    min_bary = MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
    if (REF_EMPTY == best_guess || min_bary > best_bary) {
      best_guess = guess;
      best_bary = min_bary;
    }
  }

  RUS(REF_EMPTY, best_guess, "failed to find cell");

  *tet = best_guess;
  RSS(ref_cell_nodes(ref_cell, best_guess, nodes), "cell");
  RSS(ref_node_bary4(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}